

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O2

wchar_t project_player_handler_LIGHT(project_player_handler_context_t *context)

{
  player *ppVar1;
  _Bool _Var2;
  uint32_t uVar3;
  long lVar4;
  player_state_conflict *ppVar5;
  undefined1 *puVar6;
  player_state_conflict in_stack_fffffffffffffea8;
  
  ppVar5 = &player->state;
  puVar6 = &stack0xfffffffffffffea8;
  for (lVar4 = 0x13c; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = (char)ppVar5->stat_add[0];
    ppVar5 = (player_state_conflict *)((long)ppVar5->stat_add + 1);
    puVar6 = puVar6 + 1;
  }
  _Var2 = player_resists_effects(in_stack_fffffffffffffea8,L'\x05');
  ppVar1 = player;
  if (_Var2) {
    msg("You resist the effect!");
  }
  else {
    uVar3 = Rand_div(5);
    player_inc_timed(ppVar1,L'\x02',uVar3 + L'\x03',true,true,true);
    if (L'Ĭ' < context->dam) {
      _Var2 = player_inc_check(player,L'\x04',false);
      if (_Var2) {
        msg("You are dazzled!");
      }
      ppVar1 = player;
      uVar3 = Rand_div(context->dam / 100);
      player_inc_timed(ppVar1,L'\x04',uVar3 + L'\x03',true,true,true);
    }
  }
  return L'\0';
}

Assistant:

static int project_player_handler_LIGHT(project_player_handler_context_t *context)
{
	if (player_resists_effects(player->state, ELEM_LIGHT)) {
		msg("You resist the effect!");
		return 0;
	}

	(void)player_inc_timed(player, TMD_BLIND, 2 + randint1(5), true, true,
		true);

	/* Confusion for strong unresisted light */
	if (context->dam > 300) {
		/* Check for resistance before issuing a message. */
		if (player_inc_check(player, TMD_CONFUSED, false)) {
			msg("You are dazzled!");
		}
		(void)player_inc_timed(player, TMD_CONFUSED,
			2 + randint1(context->dam / 100), true, true, true);
	}
	return 0;
}